

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

void __thiscall cmExtraSublimeTextGenerator::Generate(cmExtraSublimeTextGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  _Base_ptr p_Var2;
  
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var2 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var2 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    do {
      CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                             (p_Var2 + 2));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 !=
             &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap)._M_t.
              _M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::Generate()
{
  // for each sub project in the project create a sublime text 2 project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    // create a project file
    this->CreateProjectFile(it->second);
    }
}